

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  GridSOA *pGVar14;
  Geometry *pGVar15;
  RTCFilterFunctionN p_Var16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  long lVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  GridSOA *pGVar32;
  ulong uVar33;
  GridSOA *pGVar34;
  ulong *puVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  GridSOA *local_a88;
  ulong local_a80;
  ulong local_a78;
  undefined1 local_a70 [16];
  RTCFilterFunctionNArguments local_a60;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  GridSOA **local_8e0;
  char local_8d8;
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  puVar35 = local_7f8;
  local_800 = root.ptr;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar92 = ZEXT1664(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar93 = ZEXT1664(auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar95 = ZEXT1664(auVar42);
  auVar40 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar73._0_4_ = auVar40._0_4_;
  auVar73._4_4_ = auVar73._0_4_;
  auVar73._8_4_ = auVar73._0_4_;
  auVar73._12_4_ = auVar73._0_4_;
  auVar40 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar30 = auVar40._0_4_;
  auVar40 = vmulss_avx512f(auVar42,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar78 = auVar40._0_4_;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar97 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar99 = ZEXT1664(auVar40);
  auVar40._8_4_ = 0x80000000;
  auVar40._0_8_ = 0x8000000080000000;
  auVar40._12_4_ = 0x80000000;
  auVar40 = vxorps_avx512vl(auVar73,auVar40);
  auVar101 = ZEXT1664(auVar40);
  auVar41._0_8_ = CONCAT44(uVar30,uVar30) ^ 0x8000000080000000;
  auVar41._8_4_ = uVar30 ^ 0x80000000;
  auVar41._12_4_ = uVar30 ^ 0x80000000;
  auVar42._0_8_ = CONCAT44(uVar78,uVar78) ^ 0x8000000080000000;
  auVar42._8_4_ = uVar78 ^ 0x80000000;
  auVar42._12_4_ = uVar78 ^ 0x80000000;
  local_a10 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar38 = true;
  auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
  do {
    uVar31 = puVar35[-1];
    puVar35 = puVar35 + -1;
    auVar96 = auVar97._0_16_;
    auVar98 = auVar99._0_16_;
    auVar40 = auVar92._0_16_;
    auVar73 = auVar93._0_16_;
    auVar94 = auVar95._0_16_;
    auVar100 = auVar101._0_16_;
    while ((uVar31 & 8) == 0) {
      uVar27 = uVar31 & 0xfffffffffffffff0;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar74._4_4_ = uVar7;
      auVar74._0_4_ = uVar7;
      auVar74._8_4_ = uVar7;
      auVar74._12_4_ = uVar7;
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + uVar33),auVar74,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + uVar33));
      auVar43 = vfmadd213ps_avx512vl(auVar45,auVar40,auVar100);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + uVar36),auVar74,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + uVar36));
      auVar44 = vmaxps_avx512vl(auVar96,auVar43);
      auVar43 = vfmadd213ps_avx512vl(auVar45,auVar73,auVar41);
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + uVar29),auVar74,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + uVar29));
      auVar45 = vfmadd213ps_avx512vl(auVar45,auVar94,auVar42);
      auVar45 = vmaxps_avx(auVar43,auVar45);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + (uVar33 ^ 0x10)),auVar74,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + (uVar33 ^ 0x10)));
      auVar45 = vmaxps_avx(auVar44,auVar45);
      auVar44 = vfmadd213ps_avx512vl(auVar43,auVar40,auVar100);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + (uVar36 ^ 0x10)),auVar74,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + (uVar36 ^ 0x10)));
      auVar44 = vminps_avx512vl(auVar98,auVar44);
      auVar46 = vfmadd213ps_avx512vl(auVar43,auVar73,auVar41);
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x80 + (uVar29 ^ 0x10)),auVar74,
                                *(undefined1 (*) [16])(uVar27 + 0x20 + (uVar29 ^ 0x10)));
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar94,auVar42);
      auVar43 = vminps_avx(auVar46,auVar43);
      auVar43 = vminps_avx(auVar44,auVar43);
      uVar18 = vcmpps_avx512vl(auVar45,auVar43,2);
      uVar30 = (uint)uVar18;
      if (((uint)uVar31 & 7) == 6) {
        uVar20 = vcmpps_avx512vl(auVar74,*(undefined1 (*) [16])(uVar27 + 0xf0),1);
        uVar19 = vcmpps_avx512vl(auVar74,*(undefined1 (*) [16])(uVar27 + 0xe0),0xd);
        uVar30 = (uint)(byte)((byte)uVar20 & (byte)uVar19 & (byte)uVar18);
      }
      if ((byte)uVar30 == 0) goto LAB_006f0adf;
      lVar28 = 0;
      for (uVar31 = (ulong)(byte)uVar30; (uVar31 & 1) == 0;
          uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar31 = *(ulong *)(uVar27 + lVar28 * 8);
      uVar30 = (uVar30 & 0xff) - 1 & uVar30 & 0xff;
      uVar39 = (ulong)uVar30;
      if (uVar30 != 0) {
        *puVar35 = uVar31;
        lVar28 = 0;
        for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar28 = lVar28 + 1;
        }
        uVar30 = uVar30 - 1 & uVar30;
        uVar39 = (ulong)uVar30;
        bVar37 = uVar30 == 0;
        while( true ) {
          puVar35 = puVar35 + 1;
          uVar31 = *(ulong *)(uVar27 + lVar28 * 8);
          if (bVar37) break;
          *puVar35 = uVar31;
          lVar28 = 0;
          for (uVar31 = uVar39; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          uVar39 = uVar39 - 1 & uVar39;
          bVar37 = uVar39 == 0;
        }
      }
    }
    if (((uint)uVar31 & 0xf) == 8) {
      pGVar14 = (pre->super_Precalculations).grid;
      uVar30 = *(uint *)(pGVar14 + 0xc);
      local_a80 = (ulong)uVar30;
      auVar43 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,*(int *)(pGVar14 + 8) + -1);
      fVar17 = auVar43._0_4_ * *(float *)(ray + k * 4 + 0x70);
      auVar45 = vroundss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),9);
      auVar45 = vminss_avx(auVar45,ZEXT416((uint)(auVar43._0_4_ + -1.0)));
      auVar44 = vmaxss_avx(auVar83._0_16_,auVar45);
      uVar78 = *(uint *)(pGVar14 + 0x10);
      local_a78 = (ulong)uVar78;
      lVar28 = (long)(int)auVar44._0_4_ * (ulong)*(uint *)(pGVar14 + 0x28) +
               (ulong)*(uint *)(pGVar14 + 0x24);
      uVar31 = uVar31 >> 4;
      lVar25 = uVar31 * 4 + lVar28;
      lVar26 = uVar31 * 4 + lVar28 + 0x2c;
      auVar45 = *(undefined1 (*) [16])(pGVar14 + local_a80 * 4 + lVar25 + 0x2c);
      auVar43 = auVar45;
      if (2 < local_a78) {
        auVar43 = *(undefined1 (*) [16])(pGVar14 + local_a80 * 8 + lVar26);
      }
      auVar46 = *(undefined1 (*) [16])(pGVar14 + uVar31 * 4 + lVar28 + 0x2c);
      if (local_a80 == 2) {
        auVar46 = vshufps_avx(auVar46,auVar46,0x54);
        auVar45 = vshufps_avx(auVar45,auVar45,0x54);
        auVar43 = vshufps_avx(auVar43,auVar43,0x54);
      }
      uVar31 = (ulong)*(uint *)(pGVar14 + 0x14);
      pGVar32 = pGVar14 + uVar31 * 4 + lVar25 + 0x2c;
      auVar74 = *(undefined1 (*) [16])(pGVar32 + local_a80 * 4);
      auVar81 = auVar74;
      if (2 < uVar78) {
        auVar81 = *(undefined1 (*) [16])(pGVar32 + local_a80 * 8);
      }
      auVar8 = *(undefined1 (*) [16])pGVar32;
      if (uVar30 == 2) {
        auVar8 = vshufps_avx(auVar8,auVar8,0x54);
        auVar74 = vshufps_avx(auVar74,auVar74,0x54);
        auVar81 = vshufps_avx(auVar81,auVar81,0x54);
      }
      pGVar34 = pGVar14 + uVar31 * 8 + lVar25 + 0x2c;
      auVar9 = *(undefined1 (*) [16])(pGVar34 + local_a80 * 4);
      auVar84 = auVar9;
      if (2 < uVar78) {
        auVar84 = *(undefined1 (*) [16])(pGVar34 + local_a80 * 8);
      }
      auVar10 = *(undefined1 (*) [16])pGVar34;
      if (uVar30 == 2) {
        auVar10 = vshufps_avx(auVar10,auVar10,0x54);
        auVar9 = vshufps_avx(auVar9,auVar9,0x54);
        auVar84 = vshufps_avx(auVar84,auVar84,0x54);
      }
      uVar27 = (ulong)(*(uint *)(pGVar14 + 0x28) & 0xfffffffc);
      auVar11 = *(undefined1 (*) [16])(pGVar14 + local_a80 * 4 + uVar27 + lVar26);
      auVar89 = auVar11;
      if (2 < uVar78) {
        auVar89 = *(undefined1 (*) [16])(pGVar14 + local_a80 * 8 + uVar27 + lVar26);
      }
      auVar12 = *(undefined1 (*) [16])(pGVar14 + uVar27 + lVar26);
      if (uVar30 == 2) {
        auVar12 = vshufps_avx(auVar12,auVar12,0x54);
        auVar11 = vshufps_avx(auVar11,auVar11,0x54);
        auVar89 = vshufps_avx(auVar89,auVar89,0x54);
      }
      pGVar32 = pGVar32 + uVar27;
      auVar13 = *(undefined1 (*) [16])(pGVar32 + local_a80 * 4);
      auVar91 = auVar13;
      if (2 < uVar78) {
        auVar91 = *(undefined1 (*) [16])(pGVar32 + local_a80 * 8);
      }
      auVar47 = *(undefined1 (*) [16])pGVar32;
      if (uVar30 == 2) {
        auVar47 = vshufps_avx512vl(auVar47,auVar47,0x54);
        auVar13 = vshufps_avx(auVar13,auVar13,0x54);
        auVar91 = vshufps_avx(auVar91,auVar91,0x54);
      }
      pGVar34 = pGVar34 + uVar27;
      auVar48 = *(undefined1 (*) [16])pGVar34;
      auVar49 = *(undefined1 (*) [16])(pGVar34 + local_a80 * 4);
      auVar50 = auVar49;
      if (2 < uVar78) {
        auVar50 = *(undefined1 (*) [16])(pGVar34 + local_a80 * 8);
      }
      if (uVar30 == 2) {
        auVar48 = vshufps_avx512vl(auVar48,auVar48,0x54);
        auVar49 = vshufps_avx512vl(auVar49,auVar49,0x54);
        auVar50 = vshufps_avx512vl(auVar50,auVar50,0x54);
      }
      local_a88 = pGVar14 + uVar31 * 0xc + lVar25 + 0x2c;
      auVar62._16_16_ = auVar45;
      auVar62._0_16_ = auVar46;
      auVar72._16_16_ = auVar43;
      auVar72._0_16_ = auVar45;
      auVar58 = vunpcklps_avx(auVar62,auVar72);
      auVar62 = vshufps_avx(auVar62,auVar62,0xa5);
      auVar72 = vshufps_avx(auVar72,auVar72,0x94);
      auVar61._16_16_ = auVar74;
      auVar61._0_16_ = auVar8;
      auVar71._16_16_ = auVar81;
      auVar71._0_16_ = auVar74;
      auVar60 = vunpcklps_avx(auVar61,auVar71);
      auVar63 = vshufps_avx(auVar61,auVar61,0xa5);
      auVar70 = vshufps_avx(auVar71,auVar71,0x94);
      auVar65._16_16_ = auVar9;
      auVar65._0_16_ = auVar10;
      auVar56._16_16_ = auVar84;
      auVar56._0_16_ = auVar9;
      auVar66 = vunpcklps_avx(auVar65,auVar56);
      auVar61 = vshufps_avx(auVar65,auVar65,0xa5);
      auVar71 = vshufps_avx(auVar56,auVar56,0x94);
      auVar57._16_16_ = auVar11;
      auVar57._0_16_ = auVar12;
      auVar52._16_16_ = auVar89;
      auVar52._0_16_ = auVar11;
      auVar56 = vunpcklps_avx(auVar57,auVar52);
      auVar59 = vshufps_avx(auVar57,auVar57,0xa5);
      auVar64 = vshufps_avx(auVar52,auVar52,0x94);
      auVar51 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar13,1);
      auVar53._16_16_ = auVar91;
      auVar53._0_16_ = auVar13;
      auVar57 = vunpcklps_avx(auVar51,auVar53);
      auVar51 = vshufps_avx(auVar51,auVar51,0xa5);
      auVar65 = vshufps_avx(auVar53,auVar53,0x94);
      auVar52 = vinsertf32x4_avx512vl(ZEXT1632(auVar48),auVar49,1);
      auVar53 = vinsertf32x4_avx512vl(ZEXT1632(auVar49),auVar50,1);
      auVar54 = vunpcklps_avx512vl(auVar52,auVar53);
      auVar52 = vshufps_avx512vl(auVar52,auVar52,0xa5);
      auVar53 = vshufps_avx512vl(auVar53,auVar53,0x94);
      auVar45 = ZEXT416((uint)(fVar17 - auVar44._0_4_));
      auVar55 = vbroadcastss_avx512vl(auVar45);
      auVar45 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar45);
      auVar67._0_4_ = auVar45._0_4_;
      auVar67._4_4_ = auVar67._0_4_;
      auVar67._8_4_ = auVar67._0_4_;
      auVar67._12_4_ = auVar67._0_4_;
      auVar67._16_4_ = auVar67._0_4_;
      auVar67._20_4_ = auVar67._0_4_;
      auVar67._24_4_ = auVar67._0_4_;
      auVar67._28_4_ = auVar67._0_4_;
      auVar56 = vmulps_avx512vl(auVar55,auVar56);
      auVar57 = vmulps_avx512vl(auVar55,auVar57);
      auVar54 = vmulps_avx512vl(auVar55,auVar54);
      auVar45 = vfmadd231ps_fma(auVar56,auVar67,auVar58);
      auVar43 = vfmadd231ps_fma(auVar57,auVar67,auVar60);
      auVar58 = vfmadd231ps_avx512vl(auVar54,auVar67,auVar66);
      auVar59 = vmulps_avx512vl(auVar55,auVar59);
      auVar51 = vmulps_avx512vl(auVar55,auVar51);
      auVar60 = vmulps_avx512vl(auVar55,auVar52);
      auVar44 = vfmadd231ps_fma(auVar59,auVar67,auVar62);
      auVar46 = vfmadd231ps_fma(auVar51,auVar67,auVar63);
      auVar61 = vfmadd231ps_avx512vl(auVar60,auVar67,auVar61);
      auVar62 = vmulps_avx512vl(auVar55,auVar64);
      auVar63 = vmulps_avx512vl(auVar55,auVar65);
      auVar59 = vmulps_avx512vl(auVar55,auVar53);
      auVar74 = vfmadd231ps_fma(auVar62,auVar67,auVar72);
      auVar81 = vfmadd231ps_fma(auVar63,auVar67,auVar70);
      uVar7 = *(undefined4 *)(ray + k * 4);
      auVar60._4_4_ = uVar7;
      auVar60._0_4_ = uVar7;
      auVar60._8_4_ = uVar7;
      auVar60._12_4_ = uVar7;
      auVar60._16_4_ = uVar7;
      auVar60._20_4_ = uVar7;
      auVar60._24_4_ = uVar7;
      auVar60._28_4_ = uVar7;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar66._4_4_ = uVar7;
      auVar66._0_4_ = uVar7;
      auVar66._8_4_ = uVar7;
      auVar66._12_4_ = uVar7;
      auVar66._16_4_ = uVar7;
      auVar66._20_4_ = uVar7;
      auVar66._24_4_ = uVar7;
      auVar66._28_4_ = uVar7;
      auVar64 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar82._4_4_ = uVar7;
      auVar82._0_4_ = uVar7;
      auVar82._8_4_ = uVar7;
      auVar82._12_4_ = uVar7;
      auVar82._16_4_ = uVar7;
      auVar82._20_4_ = uVar7;
      auVar82._24_4_ = uVar7;
      auVar82._28_4_ = uVar7;
      auVar8 = vfmadd231ps_fma(auVar59,auVar67,auVar71);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar85._4_4_ = uVar7;
      auVar85._0_4_ = uVar7;
      auVar85._8_4_ = uVar7;
      auVar85._12_4_ = uVar7;
      auVar85._16_4_ = uVar7;
      auVar85._20_4_ = uVar7;
      auVar85._24_4_ = uVar7;
      auVar85._28_4_ = uVar7;
      fVar17 = *(float *)(ray + k * 4 + 0x60);
      auVar88._4_4_ = fVar17;
      auVar88._0_4_ = fVar17;
      auVar88._8_4_ = fVar17;
      auVar88._12_4_ = fVar17;
      auVar88._16_4_ = fVar17;
      auVar88._20_4_ = fVar17;
      auVar88._24_4_ = fVar17;
      auVar88._28_4_ = fVar17;
      auVar62 = vsubps_avx(ZEXT1632(auVar45),auVar60);
      auVar72 = vsubps_avx(ZEXT1632(auVar43),auVar66);
      auVar65 = vsubps_avx512vl(auVar58,auVar64);
      in_ZMM10 = ZEXT3264(auVar65);
      auVar63 = vsubps_avx(ZEXT1632(auVar44),auVar60);
      auVar51 = vsubps_avx512vl(ZEXT1632(auVar46),auVar66);
      auVar58 = vsubps_avx512vl(auVar61,auVar64);
      auVar70 = vsubps_avx(ZEXT1632(auVar74),auVar60);
      auVar60 = vsubps_avx512vl(ZEXT1632(auVar81),auVar66);
      auVar66 = vsubps_avx512vl(ZEXT1632(auVar8),auVar64);
      auVar61 = vsubps_avx(auVar70,auVar62);
      auVar56 = vsubps_avx512vl(auVar60,auVar72);
      auVar57 = vsubps_avx512vl(auVar66,auVar65);
      auVar52 = vsubps_avx512vl(auVar62,auVar63);
      auVar53 = vsubps_avx512vl(auVar72,auVar51);
      auVar54 = vsubps_avx512vl(auVar65,auVar58);
      auVar71 = vsubps_avx(auVar63,auVar70);
      auVar55 = vsubps_avx512vl(auVar51,auVar60);
      auVar67 = vsubps_avx512vl(auVar58,auVar66);
      auVar75._0_4_ = auVar70._0_4_ + auVar62._0_4_;
      auVar75._4_4_ = auVar70._4_4_ + auVar62._4_4_;
      auVar75._8_4_ = auVar70._8_4_ + auVar62._8_4_;
      auVar75._12_4_ = auVar70._12_4_ + auVar62._12_4_;
      auVar75._16_4_ = auVar70._16_4_ + auVar62._16_4_;
      auVar75._20_4_ = auVar70._20_4_ + auVar62._20_4_;
      auVar75._24_4_ = auVar70._24_4_ + auVar62._24_4_;
      auVar75._28_4_ = auVar70._28_4_ + auVar62._28_4_;
      auVar64 = vaddps_avx512vl(auVar60,auVar72);
      auVar59 = vaddps_avx512vl(auVar66,auVar65);
      auVar68 = vmulps_avx512vl(auVar64,auVar57);
      auVar68 = vfmsub231ps_avx512vl(auVar68,auVar56,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar61);
      auVar69 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar75);
      auVar59._4_4_ = auVar56._4_4_ * auVar75._4_4_;
      auVar59._0_4_ = auVar56._0_4_ * auVar75._0_4_;
      auVar59._8_4_ = auVar56._8_4_ * auVar75._8_4_;
      auVar59._12_4_ = auVar56._12_4_ * auVar75._12_4_;
      auVar59._16_4_ = auVar56._16_4_ * auVar75._16_4_;
      auVar59._20_4_ = auVar56._20_4_ * auVar75._20_4_;
      auVar59._24_4_ = auVar56._24_4_ * auVar75._24_4_;
      auVar59._28_4_ = auVar75._28_4_;
      auVar45 = vfmsub231ps_fma(auVar59,auVar61,auVar64);
      auVar76._0_4_ = fVar17 * auVar45._0_4_;
      auVar76._4_4_ = fVar17 * auVar45._4_4_;
      auVar76._8_4_ = fVar17 * auVar45._8_4_;
      auVar76._12_4_ = fVar17 * auVar45._12_4_;
      auVar76._16_4_ = fVar17 * 0.0;
      auVar76._20_4_ = fVar17 * 0.0;
      auVar76._24_4_ = fVar17 * 0.0;
      auVar76._28_4_ = 0;
      auVar59 = vfmadd231ps_avx512vl(auVar76,auVar85,auVar69);
      local_940 = vfmadd231ps_avx512vl(auVar59,auVar82,auVar68);
      auVar77._0_4_ = auVar63._0_4_ + auVar62._0_4_;
      auVar77._4_4_ = auVar63._4_4_ + auVar62._4_4_;
      auVar77._8_4_ = auVar63._8_4_ + auVar62._8_4_;
      auVar77._12_4_ = auVar63._12_4_ + auVar62._12_4_;
      auVar77._16_4_ = auVar63._16_4_ + auVar62._16_4_;
      auVar77._20_4_ = auVar63._20_4_ + auVar62._20_4_;
      auVar77._24_4_ = auVar63._24_4_ + auVar62._24_4_;
      auVar77._28_4_ = auVar63._28_4_ + auVar62._28_4_;
      auVar59 = vaddps_avx512vl(auVar72,auVar51);
      auVar64 = vaddps_avx512vl(auVar65,auVar58);
      auVar68 = vmulps_avx512vl(auVar59,auVar54);
      auVar68 = vfmsub231ps_avx512vl(auVar68,auVar53,auVar64);
      auVar64 = vmulps_avx512vl(auVar64,auVar52);
      auVar69 = vfmsub231ps_avx512vl(auVar64,auVar54,auVar77);
      auVar64 = vmulps_avx512vl(auVar77,auVar53);
      auVar59 = vfmsub231ps_avx512vl(auVar64,auVar52,auVar59);
      auVar64._4_4_ = fVar17 * auVar59._4_4_;
      auVar64._0_4_ = fVar17 * auVar59._0_4_;
      auVar64._8_4_ = fVar17 * auVar59._8_4_;
      auVar64._12_4_ = fVar17 * auVar59._12_4_;
      auVar64._16_4_ = fVar17 * auVar59._16_4_;
      auVar64._20_4_ = fVar17 * auVar59._20_4_;
      auVar64._24_4_ = fVar17 * auVar59._24_4_;
      auVar64._28_4_ = auVar59._28_4_;
      auVar59 = vfmadd231ps_avx512vl(auVar64,auVar85,auVar69);
      local_920 = vfmadd231ps_avx512vl(auVar59,auVar82,auVar68);
      auVar68._0_4_ = auVar63._0_4_ + auVar70._0_4_;
      auVar68._4_4_ = auVar63._4_4_ + auVar70._4_4_;
      auVar68._8_4_ = auVar63._8_4_ + auVar70._8_4_;
      auVar68._12_4_ = auVar63._12_4_ + auVar70._12_4_;
      auVar68._16_4_ = auVar63._16_4_ + auVar70._16_4_;
      auVar68._20_4_ = auVar63._20_4_ + auVar70._20_4_;
      auVar68._24_4_ = auVar63._24_4_ + auVar70._24_4_;
      auVar68._28_4_ = auVar63._28_4_ + auVar70._28_4_;
      auVar63 = vaddps_avx512vl(auVar51,auVar60);
      auVar70 = vaddps_avx512vl(auVar58,auVar66);
      auVar59 = vmulps_avx512vl(auVar63,auVar67);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar55,auVar70);
      auVar70 = vmulps_avx512vl(auVar70,auVar71);
      auVar70 = vfmsub231ps_avx512vl(auVar70,auVar67,auVar68);
      auVar51._4_4_ = auVar68._4_4_ * auVar55._4_4_;
      auVar51._0_4_ = auVar68._0_4_ * auVar55._0_4_;
      auVar51._8_4_ = auVar68._8_4_ * auVar55._8_4_;
      auVar51._12_4_ = auVar68._12_4_ * auVar55._12_4_;
      auVar51._16_4_ = auVar68._16_4_ * auVar55._16_4_;
      auVar51._20_4_ = auVar68._20_4_ * auVar55._20_4_;
      auVar51._24_4_ = auVar68._24_4_ * auVar55._24_4_;
      auVar51._28_4_ = auVar68._28_4_;
      auVar45 = vfmsub231ps_fma(auVar51,auVar71,auVar63);
      auVar63 = vmulps_avx512vl(ZEXT1632(auVar45),auVar88);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar85,auVar70);
      auVar59 = vfmadd231ps_avx512vl(auVar63,auVar82,auVar59);
      auVar58._0_4_ = local_940._0_4_ + local_920._0_4_;
      auVar58._4_4_ = local_940._4_4_ + local_920._4_4_;
      auVar58._8_4_ = local_940._8_4_ + local_920._8_4_;
      auVar58._12_4_ = local_940._12_4_ + local_920._12_4_;
      auVar58._16_4_ = local_940._16_4_ + local_920._16_4_;
      auVar58._20_4_ = local_940._20_4_ + local_920._20_4_;
      auVar58._24_4_ = local_940._24_4_ + local_920._24_4_;
      auVar58._28_4_ = local_940._28_4_ + local_920._28_4_;
      local_900 = vaddps_avx512vl(auVar59,auVar58);
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_900,auVar64);
      auVar63._8_4_ = 0x34000000;
      auVar63._0_8_ = 0x3400000034000000;
      auVar63._12_4_ = 0x34000000;
      auVar63._16_4_ = 0x34000000;
      auVar63._20_4_ = 0x34000000;
      auVar63._24_4_ = 0x34000000;
      auVar63._28_4_ = 0x34000000;
      auVar63 = vmulps_avx512vl(auVar64,auVar63);
      auVar70 = vminps_avx512vl(local_940,local_920);
      auVar51 = vminps_avx512vl(auVar70,auVar59);
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar70._16_4_ = 0x80000000;
      auVar70._20_4_ = 0x80000000;
      auVar70._24_4_ = 0x80000000;
      auVar70._28_4_ = 0x80000000;
      auVar70 = vxorps_avx512vl(auVar63,auVar70);
      uVar18 = vcmpps_avx512vl(auVar51,auVar70,5);
      auVar70 = vmaxps_avx512vl(local_940,local_920);
      auVar70 = vmaxps_avx512vl(auVar70,auVar59);
      uVar20 = vcmpps_avx512vl(auVar70,auVar63,2);
      bVar21 = (byte)uVar18 | (byte)uVar20;
      if (bVar21 != 0) {
        auVar63 = vmulps_avx512vl(auVar53,auVar57);
        auVar70 = vmulps_avx512vl(auVar61,auVar54);
        auVar59 = vmulps_avx512vl(auVar52,auVar56);
        auVar51 = vmulps_avx512vl(auVar55,auVar54);
        auVar58 = vmulps_avx512vl(auVar52,auVar67);
        auVar60 = vmulps_avx512vl(auVar71,auVar53);
        auVar66 = vfmsub213ps_avx512vl(auVar56,auVar54,auVar63);
        auVar56 = vfmsub213ps_avx512vl(auVar57,auVar52,auVar70);
        auVar61 = vfmsub213ps_avx512vl(auVar61,auVar53,auVar59);
        auVar57 = vfmsub213ps_avx512vl(auVar67,auVar53,auVar51);
        auVar71 = vfmsub213ps_avx512vl(auVar71,auVar54,auVar58);
        auVar52 = vfmsub213ps_avx512vl(auVar55,auVar52,auVar60);
        vandps_avx512vl(auVar63,auVar64);
        vandps_avx512vl(auVar51,auVar64);
        uVar31 = vcmpps_avx512vl(auVar52,auVar52,1);
        vandps_avx512vl(auVar70,auVar64);
        vandps_avx512vl(auVar58,auVar64);
        uVar27 = vcmpps_avx512vl(auVar52,auVar52,1);
        vandps_avx512vl(auVar59,auVar64);
        vandps_avx512vl(auVar60,auVar64);
        uVar39 = vcmpps_avx512vl(auVar52,auVar52,1);
        bVar37 = (bool)((byte)uVar31 & 1);
        local_860._0_4_ = (uint)bVar37 * auVar66._0_4_ | (uint)!bVar37 * auVar57._0_4_;
        bVar37 = (bool)((byte)(uVar31 >> 1) & 1);
        local_860._4_4_ = (uint)bVar37 * auVar66._4_4_ | (uint)!bVar37 * auVar57._4_4_;
        bVar37 = (bool)((byte)(uVar31 >> 2) & 1);
        local_860._8_4_ = (uint)bVar37 * auVar66._8_4_ | (uint)!bVar37 * auVar57._8_4_;
        bVar37 = (bool)((byte)(uVar31 >> 3) & 1);
        local_860._12_4_ = (uint)bVar37 * auVar66._12_4_ | (uint)!bVar37 * auVar57._12_4_;
        bVar37 = (bool)((byte)(uVar31 >> 4) & 1);
        local_860._16_4_ = (uint)bVar37 * auVar66._16_4_ | (uint)!bVar37 * auVar57._16_4_;
        bVar37 = (bool)((byte)(uVar31 >> 5) & 1);
        local_860._20_4_ = (uint)bVar37 * auVar66._20_4_ | (uint)!bVar37 * auVar57._20_4_;
        bVar37 = (bool)((byte)(uVar31 >> 6) & 1);
        local_860._24_4_ = (uint)bVar37 * auVar66._24_4_ | (uint)!bVar37 * auVar57._24_4_;
        bVar37 = SUB81(uVar31 >> 7,0);
        local_860._28_4_ = (uint)bVar37 * auVar66._28_4_ | (uint)!bVar37 * auVar57._28_4_;
        bVar37 = (bool)((byte)uVar27 & 1);
        local_840._0_4_ = (uint)bVar37 * auVar56._0_4_ | (uint)!bVar37 * auVar71._0_4_;
        bVar37 = (bool)((byte)(uVar27 >> 1) & 1);
        local_840._4_4_ = (uint)bVar37 * auVar56._4_4_ | (uint)!bVar37 * auVar71._4_4_;
        bVar37 = (bool)((byte)(uVar27 >> 2) & 1);
        local_840._8_4_ = (uint)bVar37 * auVar56._8_4_ | (uint)!bVar37 * auVar71._8_4_;
        bVar37 = (bool)((byte)(uVar27 >> 3) & 1);
        local_840._12_4_ = (uint)bVar37 * auVar56._12_4_ | (uint)!bVar37 * auVar71._12_4_;
        bVar37 = (bool)((byte)(uVar27 >> 4) & 1);
        local_840._16_4_ = (uint)bVar37 * auVar56._16_4_ | (uint)!bVar37 * auVar71._16_4_;
        bVar37 = (bool)((byte)(uVar27 >> 5) & 1);
        local_840._20_4_ = (uint)bVar37 * auVar56._20_4_ | (uint)!bVar37 * auVar71._20_4_;
        bVar37 = (bool)((byte)(uVar27 >> 6) & 1);
        local_840._24_4_ = (uint)bVar37 * auVar56._24_4_ | (uint)!bVar37 * auVar71._24_4_;
        bVar37 = SUB81(uVar27 >> 7,0);
        local_840._28_4_ = (uint)bVar37 * auVar56._28_4_ | (uint)!bVar37 * auVar71._28_4_;
        bVar37 = (bool)((byte)uVar39 & 1);
        local_820._0_4_ = (float)((uint)bVar37 * auVar61._0_4_ | (uint)!bVar37 * auVar52._0_4_);
        bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
        local_820._4_4_ = (float)((uint)bVar37 * auVar61._4_4_ | (uint)!bVar37 * auVar52._4_4_);
        bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
        local_820._8_4_ = (float)((uint)bVar37 * auVar61._8_4_ | (uint)!bVar37 * auVar52._8_4_);
        bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
        local_820._12_4_ = (float)((uint)bVar37 * auVar61._12_4_ | (uint)!bVar37 * auVar52._12_4_);
        bVar37 = (bool)((byte)(uVar39 >> 4) & 1);
        local_820._16_4_ = (float)((uint)bVar37 * auVar61._16_4_ | (uint)!bVar37 * auVar52._16_4_);
        bVar37 = (bool)((byte)(uVar39 >> 5) & 1);
        local_820._20_4_ = (float)((uint)bVar37 * auVar61._20_4_ | (uint)!bVar37 * auVar52._20_4_);
        bVar37 = (bool)((byte)(uVar39 >> 6) & 1);
        local_820._24_4_ = (float)((uint)bVar37 * auVar61._24_4_ | (uint)!bVar37 * auVar52._24_4_);
        bVar37 = SUB81(uVar39 >> 7,0);
        local_820._28_4_ = (uint)bVar37 * auVar61._28_4_ | (uint)!bVar37 * auVar52._28_4_;
        auVar69._4_4_ = fVar17 * local_820._4_4_;
        auVar69._0_4_ = fVar17 * local_820._0_4_;
        auVar69._8_4_ = fVar17 * local_820._8_4_;
        auVar69._12_4_ = fVar17 * local_820._12_4_;
        auVar69._16_4_ = fVar17 * local_820._16_4_;
        auVar69._20_4_ = fVar17 * local_820._20_4_;
        auVar69._24_4_ = fVar17 * local_820._24_4_;
        auVar69._28_4_ = fVar17;
        auVar45 = vfmadd213ps_fma(auVar85,local_840,auVar69);
        auVar45 = vfmadd213ps_fma(auVar82,local_860,ZEXT1632(auVar45));
        auVar63 = ZEXT1632(CONCAT412(auVar45._12_4_ + auVar45._12_4_,
                                     CONCAT48(auVar45._8_4_ + auVar45._8_4_,
                                              CONCAT44(auVar45._4_4_ + auVar45._4_4_,
                                                       auVar45._0_4_ + auVar45._0_4_))));
        auVar86._0_4_ = auVar65._0_4_ * local_820._0_4_;
        auVar86._4_4_ = auVar65._4_4_ * local_820._4_4_;
        auVar86._8_4_ = auVar65._8_4_ * local_820._8_4_;
        auVar86._12_4_ = auVar65._12_4_ * local_820._12_4_;
        auVar86._16_4_ = auVar65._16_4_ * local_820._16_4_;
        auVar86._20_4_ = auVar65._20_4_ * local_820._20_4_;
        auVar86._24_4_ = auVar65._24_4_ * local_820._24_4_;
        auVar86._28_4_ = 0;
        auVar45 = vfmadd213ps_fma(auVar72,local_840,auVar86);
        auVar43 = vfmadd213ps_fma(auVar62,local_860,ZEXT1632(auVar45));
        auVar62 = vrcp14ps_avx512vl(auVar63);
        auVar54._8_4_ = 0x3f800000;
        auVar54._0_8_ = 0x3f8000003f800000;
        auVar54._12_4_ = 0x3f800000;
        auVar54._16_4_ = 0x3f800000;
        auVar54._20_4_ = 0x3f800000;
        auVar54._24_4_ = 0x3f800000;
        auVar54._28_4_ = 0x3f800000;
        auVar72 = vfnmadd213ps_avx512vl(auVar62,auVar63,auVar54);
        auVar45 = vfmadd132ps_fma(auVar72,auVar62,auVar62);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_a00._4_4_ = uVar7;
        local_a00._0_4_ = uVar7;
        local_a00._8_4_ = uVar7;
        local_a00._12_4_ = uVar7;
        local_a00._16_4_ = uVar7;
        local_a00._20_4_ = uVar7;
        local_a00._24_4_ = uVar7;
        local_a00._28_4_ = uVar7;
        auVar90 = ZEXT3264(local_a00);
        local_880 = ZEXT1632(CONCAT412(auVar45._12_4_ * (auVar43._12_4_ + auVar43._12_4_),
                                       CONCAT48(auVar45._8_4_ * (auVar43._8_4_ + auVar43._8_4_),
                                                CONCAT44(auVar45._4_4_ *
                                                         (auVar43._4_4_ + auVar43._4_4_),
                                                         auVar45._0_4_ *
                                                         (auVar43._0_4_ + auVar43._0_4_)))));
        uVar18 = vcmpps_avx512vl(local_880,local_a00,2);
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar55._4_4_ = uVar7;
        auVar55._0_4_ = uVar7;
        auVar55._8_4_ = uVar7;
        auVar55._12_4_ = uVar7;
        auVar55._16_4_ = uVar7;
        auVar55._20_4_ = uVar7;
        auVar55._24_4_ = uVar7;
        auVar55._28_4_ = uVar7;
        uVar20 = vcmpps_avx512vl(local_880,auVar55,0xd);
        bVar21 = (byte)uVar18 & (byte)uVar20 & bVar21;
        if (bVar21 != 0) {
          uVar31 = vcmpps_avx512vl(auVar63,ZEXT832(0) << 0x20,4);
          uVar31 = bVar21 & uVar31;
          local_8d8 = (char)uVar31;
          if (local_8d8 != '\0') {
            local_8e0 = &local_a88;
            pGVar15 = (context->scene->geometries).items[*(uint *)(pGVar14 + 0x18)].ptr;
            if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006f0bb4:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar38;
              }
              auVar22._8_4_ = 0x219392ef;
              auVar22._0_8_ = 0x219392ef219392ef;
              auVar22._12_4_ = 0x219392ef;
              auVar22._16_4_ = 0x219392ef;
              auVar22._20_4_ = 0x219392ef;
              auVar22._24_4_ = 0x219392ef;
              auVar22._28_4_ = 0x219392ef;
              uVar27 = vcmpps_avx512vl(auVar64,auVar22,5);
              auVar45 = *(undefined1 (*) [16])(local_a88 + local_a80 * 4);
              auVar43 = auVar45;
              if (2 < local_a78) {
                auVar43 = *(undefined1 (*) [16])(local_a88 + local_a80 * 8);
              }
              auVar44 = *(undefined1 (*) [16])local_a88;
              if (local_a80 == 2) {
                auVar44 = vpshufd_avx(auVar44,0x54);
                auVar45 = vpshufd_avx(auVar45,0x54);
                auVar43 = vpshufd_avx(auVar43,0x54);
              }
              auVar62 = vrcp14ps_avx512vl(local_900);
              auVar87._8_4_ = 0x3f800000;
              auVar87._0_8_ = 0x3f8000003f800000;
              auVar87._12_4_ = 0x3f800000;
              auVar87._16_4_ = 0x3f800000;
              auVar87._20_4_ = 0x3f800000;
              auVar87._24_4_ = 0x3f800000;
              auVar87._28_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_fma(local_900,auVar62,auVar87);
              auVar62 = vfmadd132ps_avx512vl(ZEXT1632(auVar46),auVar62,auVar62);
              fVar1 = (float)((uint)((byte)uVar27 & 1) * auVar62._0_4_);
              fVar17 = (float)((uint)((byte)(uVar27 >> 1) & 1) * auVar62._4_4_);
              fVar2 = (float)((uint)((byte)(uVar27 >> 2) & 1) * auVar62._8_4_);
              fVar3 = (float)((uint)((byte)(uVar27 >> 3) & 1) * auVar62._12_4_);
              fVar4 = (float)((uint)((byte)(uVar27 >> 4) & 1) * auVar62._16_4_);
              fVar5 = (float)((uint)((byte)(uVar27 >> 5) & 1) * auVar62._20_4_);
              fVar6 = (float)((uint)((byte)(uVar27 >> 6) & 1) * auVar62._24_4_);
              auVar23._4_4_ = local_940._4_4_ * fVar17;
              auVar23._0_4_ = local_940._0_4_ * fVar1;
              auVar23._8_4_ = local_940._8_4_ * fVar2;
              auVar23._12_4_ = local_940._12_4_ * fVar3;
              auVar23._16_4_ = local_940._16_4_ * fVar4;
              auVar23._20_4_ = local_940._20_4_ * fVar5;
              auVar23._24_4_ = local_940._24_4_ * fVar6;
              auVar23._28_4_ = local_940._28_4_;
              auVar59 = vminps_avx(auVar23,auVar87);
              auVar24._4_4_ = fVar17 * local_920._4_4_;
              auVar24._0_4_ = fVar1 * local_920._0_4_;
              auVar24._8_4_ = fVar2 * local_920._8_4_;
              auVar24._12_4_ = fVar3 * local_920._12_4_;
              auVar24._16_4_ = fVar4 * local_920._16_4_;
              auVar24._20_4_ = fVar5 * local_920._20_4_;
              auVar24._24_4_ = fVar6 * local_920._24_4_;
              auVar24._28_4_ = local_920._28_4_;
              auVar64 = vminps_avx(auVar24,auVar87);
              auVar79._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar44;
              auVar79._16_16_ = ZEXT116(1) * auVar45;
              auVar80._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar45;
              auVar80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar43
              ;
              auVar62 = vpunpckldq_avx2(auVar79,auVar80);
              auVar63 = vpshufd_avx2(auVar79,0xa5);
              auVar61 = vpshufd_avx2(auVar80,0x94);
              auVar72 = vpsrld_avx2(auVar62,0x10);
              in_ZMM10 = ZEXT864(0) << 0x20;
              auVar62 = vpblendw_avx2(auVar62,ZEXT832(0) << 0x20,0xaa);
              auVar62 = vcvtdq2ps_avx(auVar62);
              auVar72 = vcvtdq2ps_avx(auVar72);
              auVar70 = vpsrld_avx2(auVar63,0x10);
              auVar63 = vpblendw_avx2(auVar63,ZEXT832(0) << 0x20,0xaa);
              auVar63 = vcvtdq2ps_avx(auVar63);
              auVar70 = vcvtdq2ps_avx(auVar70);
              auVar71 = vpsrld_avx2(auVar61,0x10);
              auVar61 = vpblendw_avx2(auVar61,ZEXT832(0) << 0x20,0xaa);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar71 = vcvtdq2ps_avx(auVar71);
              auVar51 = vsubps_avx(auVar87,auVar59);
              auVar51 = vsubps_avx(auVar51,auVar64);
              local_8c0[0] = auVar64._0_4_ * auVar61._0_4_ * 0.00012207031 +
                             auVar59._0_4_ * auVar63._0_4_ * 0.00012207031 +
                             auVar51._0_4_ * auVar62._0_4_ * 0.00012207031;
              local_8c0[1] = auVar64._4_4_ * auVar61._4_4_ * 0.00012207031 +
                             auVar59._4_4_ * auVar63._4_4_ * 0.00012207031 +
                             auVar51._4_4_ * auVar62._4_4_ * 0.00012207031;
              local_8c0[2] = auVar64._8_4_ * auVar61._8_4_ * 0.00012207031 +
                             auVar59._8_4_ * auVar63._8_4_ * 0.00012207031 +
                             auVar51._8_4_ * auVar62._8_4_ * 0.00012207031;
              local_8c0[3] = auVar64._12_4_ * auVar61._12_4_ * 0.00012207031 +
                             auVar59._12_4_ * auVar63._12_4_ * 0.00012207031 +
                             auVar51._12_4_ * auVar62._12_4_ * 0.00012207031;
              fStack_8b0 = auVar64._16_4_ * auVar61._16_4_ * 0.00012207031 +
                           auVar59._16_4_ * auVar63._16_4_ * 0.00012207031 +
                           auVar51._16_4_ * auVar62._16_4_ * 0.00012207031;
              fStack_8ac = auVar64._20_4_ * auVar61._20_4_ * 0.00012207031 +
                           auVar59._20_4_ * auVar63._20_4_ * 0.00012207031 +
                           auVar51._20_4_ * auVar62._20_4_ * 0.00012207031;
              fStack_8a8 = auVar64._24_4_ * auVar61._24_4_ * 0.00012207031 +
                           auVar59._24_4_ * auVar63._24_4_ * 0.00012207031 +
                           auVar51._24_4_ * auVar62._24_4_ * 0.00012207031;
              fStack_8a4 = auVar61._28_4_ + auVar63._28_4_ + auVar64._28_4_;
              local_8a0[0] = auVar64._0_4_ * auVar71._0_4_ * 0.00012207031 +
                             auVar59._0_4_ * auVar70._0_4_ * 0.00012207031 +
                             auVar51._0_4_ * auVar72._0_4_ * 0.00012207031;
              local_8a0[1] = auVar64._4_4_ * auVar71._4_4_ * 0.00012207031 +
                             auVar59._4_4_ * auVar70._4_4_ * 0.00012207031 +
                             auVar51._4_4_ * auVar72._4_4_ * 0.00012207031;
              local_8a0[2] = auVar64._8_4_ * auVar71._8_4_ * 0.00012207031 +
                             auVar59._8_4_ * auVar70._8_4_ * 0.00012207031 +
                             auVar51._8_4_ * auVar72._8_4_ * 0.00012207031;
              local_8a0[3] = auVar64._12_4_ * auVar71._12_4_ * 0.00012207031 +
                             auVar59._12_4_ * auVar70._12_4_ * 0.00012207031 +
                             auVar51._12_4_ * auVar72._12_4_ * 0.00012207031;
              fStack_890 = auVar64._16_4_ * auVar71._16_4_ * 0.00012207031 +
                           auVar59._16_4_ * auVar70._16_4_ * 0.00012207031 +
                           auVar51._16_4_ * auVar72._16_4_ * 0.00012207031;
              fStack_88c = auVar64._20_4_ * auVar71._20_4_ * 0.00012207031 +
                           auVar59._20_4_ * auVar70._20_4_ * 0.00012207031 +
                           auVar51._20_4_ * auVar72._20_4_ * 0.00012207031;
              fStack_888 = auVar64._24_4_ * auVar71._24_4_ * 0.00012207031 +
                           auVar59._24_4_ * auVar70._24_4_ * 0.00012207031 +
                           auVar51._24_4_ * auVar72._24_4_ * 0.00012207031;
              fStack_884 = auVar61._28_4_ + auVar70._28_4_ + auVar51._28_4_;
              uVar27 = 0;
              for (uVar39 = uVar31; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                uVar27 = uVar27 + 1;
              }
              local_a20 = vpbroadcastd_avx512vl();
              local_a30 = vpbroadcastd_avx512vl();
              auVar83 = ZEXT864(0) << 0x20;
              do {
                fVar17 = local_8c0[uVar27];
                local_9a0._4_4_ = fVar17;
                local_9a0._0_4_ = fVar17;
                local_9a0._8_4_ = fVar17;
                local_9a0._12_4_ = fVar17;
                fVar17 = local_8a0[uVar27];
                local_990._4_4_ = fVar17;
                local_990._0_4_ = fVar17;
                local_990._8_4_ = fVar17;
                local_990._12_4_ = fVar17;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + uVar27 * 4);
                local_a60.context = context->user;
                local_9d0 = *(undefined4 *)(local_860 + uVar27 * 4);
                uVar7 = *(undefined4 *)(local_840 + uVar27 * 4);
                local_9c0._4_4_ = uVar7;
                local_9c0._0_4_ = uVar7;
                local_9c0._8_4_ = uVar7;
                local_9c0._12_4_ = uVar7;
                uVar7 = *(undefined4 *)(local_820 + uVar27 * 4);
                local_9b0._4_4_ = uVar7;
                local_9b0._0_4_ = uVar7;
                local_9b0._8_4_ = uVar7;
                local_9b0._12_4_ = uVar7;
                local_980 = local_a30._0_8_;
                uStack_978 = local_a30._8_8_;
                local_970 = local_a20;
                vpcmpeqd_avx2(ZEXT1632(local_a20),ZEXT1632(local_a20));
                uStack_95c = (local_a60.context)->instID[0];
                local_960 = uStack_95c;
                uStack_958 = uStack_95c;
                uStack_954 = uStack_95c;
                uStack_950 = (local_a60.context)->instPrimID[0];
                uStack_94c = uStack_950;
                uStack_948 = uStack_950;
                uStack_944 = uStack_950;
                local_a70 = local_a10;
                local_a60.valid = (int *)local_a70;
                local_a60.geometryUserPtr = pGVar15->userPtr;
                local_a60.hit = (RTCHitN *)&local_9d0;
                local_a60.N = 4;
                local_a60.ray = (RTCRayN *)ray;
                uStack_9cc = local_9d0;
                uStack_9c8 = local_9d0;
                uStack_9c4 = local_9d0;
                if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                  (*pGVar15->occlusionFilterN)(&local_a60);
                  auVar90 = ZEXT3264(local_a00);
                  auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                uVar39 = vptestmd_avx512vl(local_a70,local_a70);
                if ((uVar39 & 0xf) != 0) {
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                    (*p_Var16)(&local_a60);
                    auVar90 = ZEXT3264(local_a00);
                    auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  uVar39 = vptestmd_avx512vl(local_a70,local_a70);
                  uVar39 = uVar39 & 0xf;
                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar37 = (bool)((byte)uVar39 & 1);
                  auVar45._0_4_ =
                       (uint)bVar37 * auVar43._0_4_ | (uint)!bVar37 * *(int *)(local_a60.ray + 0x80)
                  ;
                  bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar45._4_4_ =
                       (uint)bVar37 * auVar43._4_4_ | (uint)!bVar37 * *(int *)(local_a60.ray + 0x84)
                  ;
                  bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar45._8_4_ =
                       (uint)bVar37 * auVar43._8_4_ | (uint)!bVar37 * *(int *)(local_a60.ray + 0x88)
                  ;
                  bVar37 = SUB81(uVar39 >> 3,0);
                  auVar45._12_4_ =
                       (uint)bVar37 * auVar43._12_4_ |
                       (uint)!bVar37 * *(int *)(local_a60.ray + 0x8c);
                  *(undefined1 (*) [16])(local_a60.ray + 0x80) = auVar45;
                  if ((byte)uVar39 != 0) goto LAB_006f0bb4;
                }
                auVar101 = ZEXT1664(auVar100);
                auVar99 = ZEXT1664(auVar98);
                auVar97 = ZEXT1664(auVar96);
                auVar95 = ZEXT1664(auVar94);
                auVar93 = ZEXT1664(auVar73);
                auVar92 = ZEXT1664(auVar40);
                *(int *)(ray + k * 4 + 0x80) = auVar90._0_4_;
                uVar39 = uVar27 & 0x3f;
                uVar27 = 0;
                uVar31 = uVar31 ^ 1L << uVar39;
                for (uVar39 = uVar31; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000)
                {
                  uVar27 = uVar27 + 1;
                }
              } while (uVar31 != 0);
              goto LAB_006f0adf;
            }
          }
        }
      }
      auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      uVar27 = *(ulong *)*(GridSOA **)(uVar31 & 0xfffffffffffffff0);
      (pre->super_Precalculations).grid = *(GridSOA **)(uVar31 & 0xfffffffffffffff0);
      if (uVar27 != 0) {
        *puVar35 = uVar27;
        puVar35 = puVar35 + 1;
      }
    }
LAB_006f0adf:
    bVar38 = puVar35 != &local_800;
    if (!bVar38) {
      return bVar38;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }